

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapD.c
# Opt level: O2

void Fxu_HeapDoubleCheck(Fxu_HeapDouble *p)

{
  Fxu_Double *pDiv;
  int iVar1;
  
  iVar1 = 1;
  while( true ) {
    p->i = iVar1;
    if ((p->nItems < iVar1) || (pDiv = p->pTree[iVar1], pDiv == (Fxu_Double *)0x0)) break;
    if (pDiv->HNum != iVar1) {
      __assert_fail("pDiv->HNum == p->i",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuHeapD.c"
                    ,0x9d,"void Fxu_HeapDoubleCheck(Fxu_HeapDouble *)");
    }
    Fxu_HeapDoubleCheckOne(p,pDiv);
    iVar1 = p->i + 1;
  }
  return;
}

Assistant:

void Fxu_HeapDoubleCheck( Fxu_HeapDouble * p )
{
	Fxu_Double * pDiv;
	Fxu_HeapDoubleForEachItem( p, pDiv )
	{
		assert( pDiv->HNum == p->i );
        Fxu_HeapDoubleCheckOne( p, pDiv );
	}
}